

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O2

void __thiscall
OmegaOP::algoSMOOTHING(OmegaOP *this,vector<double,_std::allocator<double>_> *data,double minAngle)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  long lVar4;
  OmegaOP *pOVar5;
  bool bVar6;
  double **ppdVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  Costs cost;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  OmegaOP *local_58;
  double *local_50;
  double local_48;
  ulong local_40;
  double minAngle_local;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = this->nbStates;
  minAngle_local = minAngle;
  Costs::Costs(&cost);
  ppdVar7 = preprocessing(this,data);
  this->S12P = ppdVar7;
  local_70 = (ulong)((int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1);
  lVar12 = (ulong)uVar9 * 8;
  local_68 = (ulong)uVar9;
  local_60 = lVar12;
  local_58 = this;
  for (local_90 = 2; local_90 < (uint)local_70; local_90 = local_90 + 1) {
    for (uVar10 = 0; uVar10 != local_68; uVar10 = uVar10 + 1) {
      local_84 = 0;
      local_8c = 1;
      local_80 = INFINITY;
      local_88 = 0;
      local_40 = uVar10;
      while( true ) {
        if (local_90 <= local_8c) break;
        local_78 = 0;
        for (lVar13 = 0; lVar12 != lVar13; lVar13 = lVar13 + 8) {
          pdVar3 = this->states;
          bVar6 = Costs::angleTest(&cost,(uint *)((ulong)local_8c * 4 +
                                                 *(long *)((long)this->lastChpt + lVar13)),&local_8c
                                   ,&local_90,
                                   pdVar3 + *(uint *)(*(long *)((long)this->lastIndState + lVar13) +
                                                     (ulong)local_8c * 4),
                                   (double *)((long)pdVar3 + lVar13),pdVar3 + uVar10,&minAngle_local
                                  );
          pOVar5 = local_58;
          lVar4 = local_60;
          if (bVar6) {
            uVar8 = (ulong)local_8c;
            local_48 = *(double *)(*(long *)((long)this->Q + lVar13) + uVar8 * 8);
            ppdVar7 = this->S12P;
            uVar11 = (ulong)local_90;
            local_50 = *ppdVar7 + uVar11;
            dVar14 = Costs::slopeCost(&cost,(double *)((long)this->states + lVar13),
                                      this->states + uVar10,&local_8c,&local_90,*ppdVar7 + uVar8,
                                      local_50,ppdVar7[1] + uVar8,ppdVar7[1] + uVar11,
                                      ppdVar7[2] + uVar8,ppdVar7[2] + uVar11);
            dVar14 = dVar14 + local_48 + pOVar5->penalty;
            uVar9 = (uint)local_78;
            this = pOVar5;
            lVar12 = lVar4;
            if (dVar14 < local_80) {
              local_84 = local_8c;
              local_88 = uVar9;
              local_80 = dVar14;
            }
          }
          else {
            uVar9 = (uint)local_78;
          }
          local_78 = (ulong)(uVar9 + 1);
          uVar10 = local_40;
        }
        local_8c = local_8c + 1;
      }
      this->Q[uVar10][local_90] = local_80;
      this->lastChpt[uVar10][local_90] = local_84;
      this->lastIndState[uVar10][local_90] = local_88;
    }
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algoSMOOTHING(std::vector< double >& data, double minAngle)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(cost.angleTest(lastChpt[u][t], t, T, states[lastIndState[u][t]], states[u], states[v], minAngle))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}